

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int starma(int ip,int iq,double *phi,double *theta,double *A,double *P,double *V)

{
  double *xnext_00;
  double *thetab_00;
  double *xrow_00;
  double *rbar_00;
  double *rbar;
  double *xrow;
  double *xnext;
  double *thetab;
  double recres;
  double weight;
  double ynext;
  double phii;
  double phij;
  double ssqerr;
  double vj;
  int local_80;
  int indn;
  int indi;
  int indj;
  int ind2;
  int ind1;
  int npr1;
  int npr;
  int ifail;
  int irank;
  int ir1;
  int j;
  int ind;
  int i;
  int nrbar;
  int np;
  int ir;
  int ifault;
  double *P_local;
  double *A_local;
  double *theta_local;
  double *phi_local;
  int local_18;
  int iq_local;
  int ip_local;
  
  np = (int)(ip < 0);
  if (iq < 0) {
    np = 2;
  }
  if (ip * ip + iq * iq == 0) {
    np = 4;
  }
  nrbar = iq + 1;
  if (nrbar < ip) {
    nrbar = ip;
  }
  i = (nrbar * (nrbar + 1)) / 2;
  ind = (i * (i + -1)) / 2;
  if (nrbar == 1) {
    np = 8;
  }
  if (np == 0) {
    _ir = P;
    P_local = A;
    A_local = theta;
    theta_local = phi;
    phi_local._4_4_ = iq;
    local_18 = ip;
    xnext_00 = (double *)malloc((long)i << 3);
    thetab_00 = (double *)malloc((long)i << 3);
    xrow_00 = (double *)malloc((long)i << 3);
    rbar_00 = (double *)malloc((long)ind << 3);
    for (j = 1; j < nrbar; j = j + 1) {
      P_local[j] = 0.0;
      if (local_18 <= j) {
        theta_local[j] = 0.0;
      }
      V[j] = 0.0;
      if (j < phi_local._4_4_ + 1) {
        V[j] = A_local[j + -1];
      }
    }
    *P_local = 0.0;
    if (local_18 == 0) {
      *theta_local = 0.0;
    }
    *V = 1.0;
    ir1 = nrbar;
    for (irank = 1; irank < nrbar; irank = irank + 1) {
      ssqerr = V[irank];
      for (j = irank; j < nrbar; j = j + 1) {
        V[ir1] = V[j] * ssqerr;
        ir1 = ir1 + 1;
      }
    }
    if (local_18 == 0) {
      vj._4_4_ = i;
      ir1 = i;
      for (j = 0; j < nrbar; j = j + 1) {
        for (irank = 0; irank <= j; irank = irank + 1) {
          ir1 = ir1 + -1;
          _ir[ir1] = V[ir1];
          if (irank != 0) {
            vj._4_4_ = vj._4_4_ + -1;
            _ir[ir1] = _ir[vj._4_4_] + _ir[ir1];
          }
        }
      }
    }
    else {
      ifail = nrbar + -1;
      npr = 0;
      npr1 = 0;
      phij = 0.0;
      for (j = 0; j < ind; j = j + 1) {
        rbar_00[j] = 0.0;
      }
      for (j = 0; j < i; j = j + 1) {
        _ir[j] = 0.0;
        thetab_00[j] = 0.0;
        xnext_00[j] = 0.0;
      }
      ir1 = 0;
      indj = -1;
      indn = i - nrbar;
      ind2 = indn + 1;
      indi = indn + -1;
      ind1 = indn;
      for (irank = 0; irank < nrbar; irank = irank + 1) {
        phii = theta_local[irank];
        xnext_00[indn] = 0.0;
        indn = indn + 1;
        local_80 = ind2 + irank;
        for (j = irank; j < nrbar; j = j + 1) {
          weight = V[ir1];
          ir1 = ir1 + 1;
          ynext = theta_local[j];
          if ((irank != nrbar + -1) && (xnext_00[indn] = -ynext, j != nrbar + -1)) {
            xnext_00[local_80] = xnext_00[local_80] - phii;
            indj = indj + 1;
            xnext_00[indj] = -1.0;
          }
          xnext_00[ind1] = -ynext * phii;
          indi = indi + 1;
          if (i <= indi) {
            indi = 0;
          }
          xnext_00[indi] = xnext_00[indi] + 1.0;
          recres = 1.0;
          npr1 = inclu2(i,ind,1.0,xnext_00,xrow_00,weight,_ir,rbar_00,thetab_00,&phij,
                        (double *)&thetab,&npr);
          xnext_00[indi] = 0.0;
          if (j != nrbar + -1) {
            xnext_00[local_80] = 0.0;
            local_80 = local_80 + 1;
            xnext_00[indj] = 0.0;
          }
        }
      }
      regres(i,ind,rbar_00,thetab_00,_ir);
      ir1 = ind1;
      for (j = 0; j < nrbar; j = j + 1) {
        xnext_00[j] = _ir[ir1];
        ir1 = ir1 + 1;
      }
      ir1 = i;
      indj = ind1;
      for (j = 0; j < ind1; j = j + 1) {
        _ir[ir1 + -1] = _ir[indj + -1];
        ir1 = ir1 + -1;
        indj = indj + -1;
      }
      for (j = 0; j < nrbar; j = j + 1) {
        _ir[j] = xnext_00[j];
      }
    }
    free(xnext_00);
    free(thetab_00);
    free(xrow_00);
    free(rbar_00);
    iq_local = np;
  }
  else {
    iq_local = np;
  }
  return iq_local;
}

Assistant:

int starma(int ip, int iq,double *phi,double *theta,double *A,double *P,double *V) {
	int ifault,ir,np,nrbar,i,ind,j,ir1,irank,ifail;
	int npr, npr1, ind1, ind2, indj,indi,indn;
	double vj,ssqerr,phij,phii,ynext,weight,recres;
	double *thetab, *xnext, *xrow, *rbar;
	ifault = 0;
	/*
	c   algorithm as 154 appl. statist. (1980) vol.29, no.3
	c
	c   invoking this subroutine sets the values of v and phi, and obtains
	c   the initial values of a and p.
	c   this routine is not suitable for use with an ar(1) process.
	c   in this case the following instructions should be used for
	c   initialisation.
	c          v(1)=1.0
	c          a(1)=0.0
	c          p(1)=1.0/(1.0-phi(1)*phi(1))
	c
	*/

	// Check for input errors

	if (ip < 0) {
		ifault = 1;
	}
	if (iq < 0) {
		ifault = 2;
	}

	if (ip*ip + iq*iq == 0) {
		ifault = 4;
	}

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	np = (ir * (ir + 1)) / 2;
	nrbar = (np * (np - 1)) / 2;

	if (ir == 1) {
		ifault = 8;
	}
	
	if (ifault != 0) {
		return ifault;
	}

	xnext = (double*)malloc(sizeof(double)* np);
	thetab = (double*)malloc(sizeof(double)* np);
	xrow = (double*)malloc(sizeof(double)* np);
	rbar = (double*)malloc(sizeof(double)* nrbar);

	for (i = 1; i < ir;++i) {
		A[i] = 0.0;
		if (i >= ip) {
			phi[i] = 0.0;
		}
		V[i] = 0.0;
		if (i < iq+1) {
			V[i] = theta[i - 1];
		}
	}

	A[0] = 0.0;
	if (ip == 0) {
		phi[0] = 0.0;
	}
	V[0] = 1.0;
	ind = ir;

	for (j = 1; j < ir; ++j) {
		vj = V[j];
		for (i = j; i < ir; ++i) {
			V[ind] = V[i] * vj;
			ind++;
		}
	}

	if (ip != 0) {//300
		/*
		c   now find p(0).

c   the set of equations s*vec(p(0))=vec(v) is solved for vec(p(0)).
c   s is generated row by row in the array xnext.
c   the order of elements in p is changed, so as to bring more leading
c   zeros into the rows of s, hence achieving a reduction of computing
c   time.
		*/
		ir1 = ir - 1;
		irank = 0;
		ifail = 0;
		ssqerr = 0.0;

		for (i = 0; i < nrbar; ++i) {
			rbar[i] = 0.0;
		}
		for (i = 0; i < np; ++i) {
			P[i] = 0.0;
			thetab[i] = 0.0;
			xnext[i] = 0.0;
		}
		ind = 0;
		ind1 = -1;
		npr = np - ir;
		npr1 = npr + 1;
		indj = npr;
		ind2 = npr-1;

		for (j = 0; j < ir; ++j) {//110
			phij = phi[j];
			xnext[indj] = 0.0;
			indj = indj + 1;
			indi = npr1 + j;

			for (i = j; i < ir; ++i) {//110
				ynext = V[ind];
				ind++;
				phii = phi[i];
				if (j != (ir - 1)) {
					xnext[indj] = -phii;
					if (i != (ir - 1)) {
						xnext[indi] -= phij;
						ind1 ++;
						xnext[ind1] = -1.0;
					}
				}//100
				xnext[npr] = -phii*phij;
				ind2++;
				if (ind2 >= np) {
					ind2 = 0;
				}
				xnext[ind2] += 1.0;
				weight = 1.0;
				ifail = inclu2(np, nrbar, weight, xnext, xrow, ynext, P, rbar, thetab, &ssqerr, &recres, &irank);
				//mdisplay(P, 1, np);
				xnext[ind2] = 0.0;
				if (i != (ir - 1)) {
					xnext[indi] = 0.0;
					indi++;
					xnext[ind1] = 0.0;
				}
			}//110
		}//110
		//mdisplay(P, 1, np);
		regres(np, nrbar, rbar, thetab, P);
		/*
		Now Re-order P
		*/
		ind = npr;
		for (i = 0; i < ir; ++i) {
			ind++;
			xnext[i] = P[ind - 1];
		}
		ind = np;
		ind1 = npr;

		for (i = 0; i < npr; ++i) {
			P[ind - 1] = P[ind1 - 1];
			ind--;
			ind1--;
		}

		for (i = 0; i < ir; ++i) {
			P[i] = xnext[i];
		}
		//return ifault;
	}
	else {

		// P[0] is obtained by back-substitution for a Moving Average process

		indn = np;
		ind = np;
		for (i = 0; i < ir; i++) {
			for (j = 0; j <= i; j++) {
				ind--;
				P[ind] = V[ind];
				if (j != 0)  {
					indn--;
					P[ind] += P[indn];
				}
			}
		}
	}

	free(xnext);
	free(thetab);
	free(xrow);
	free(rbar);
	return ifault;
}